

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# durand_kerner_method.cc
# Opt level: O3

bool __thiscall
sptk::DurandKernerMethod::Run
          (DurandKernerMethod *this,vector<double,_std::allocator<double>_> *coefficients,
          vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *roots,
          bool *is_converged)

{
  double *pdVar1;
  complex<double> *__z;
  pointer pdVar2;
  pointer pdVar3;
  double dVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  uint uVar7;
  pointer pcVar8;
  long lVar9;
  long lVar10;
  size_type __new_size;
  ulong uVar11;
  pointer pcVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  double dVar18;
  double dVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  double local_b8;
  double dStack_b0;
  double *local_a0;
  undefined1 local_88 [16];
  ulong local_78;
  long local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  complex<double> local_48;
  
  if ((this->is_valid_ != true) || (bVar6 = false, is_converged == (bool *)0x0)) {
    return false;
  }
  if (roots != (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)0x0) {
    local_a0 = (coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
    __new_size = (long)(coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)local_a0 >> 3;
    uVar7 = this->num_order_;
    if (__new_size == (long)(int)uVar7) {
      pcVar8 = (roots->
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if ((long)(roots->
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)pcVar8 >> 4 != __new_size) {
        std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize
                  (roots,__new_size);
        local_a0 = (coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        pcVar8 = (roots->
                 super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar7 = this->num_order_;
      }
      uVar11 = (ulong)uVar7;
      *is_converged = false;
      dVar19 = 0.0;
      if (1 < (int)uVar7) {
        lVar9 = 1;
        dVar18 = 0.0;
        do {
          pdVar1 = local_a0 + lVar9;
          lVar9 = lVar9 + 1;
          dVar4 = pow(ABS(*pdVar1),1.0 / (double)(int)lVar9);
          dVar19 = dVar4 + dVar4;
          if (dVar4 + dVar4 <= dVar18) {
            dVar19 = dVar18;
          }
          uVar11 = (ulong)this->num_order_;
          dVar18 = dVar19;
        } while (lVar9 < (long)uVar11);
      }
      if (0 < (int)uVar11) {
        dVar18 = -*local_a0 / (double)(int)uVar11;
        pdVar2 = (this->cosine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar3 = (this->sine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar9 = 0;
        do {
          *(double *)(pcVar8->_M_value + lVar9 * 2) =
               *(double *)((long)pdVar2 + lVar9) * dVar19 + dVar18;
          *(double *)(pcVar8->_M_value + lVar9 * 2 + 8) =
               *(double *)((long)pdVar3 + lVar9) * dVar19 + dVar18;
          lVar9 = lVar9 + 8;
        } while ((uVar11 & 0xffffffff) << 3 != lVar9);
      }
      if (0 < this->num_iteration_) {
        local_78 = 0;
        do {
          if ((int)uVar11 < 1) {
LAB_00105bf0:
            *is_converged = true;
            break;
          }
          bVar6 = true;
          lVar9 = 0;
          do {
            if ((int)uVar11 < 1) {
              dVar19 = 0.0;
              uVar14 = 0;
              dStack_b0 = 0.0;
              local_b8 = 0.0;
LAB_00105b70:
              dVar18 = (double)__divdc3(uVar14,dVar19,local_b8._0_4_,dStack_b0);
              dVar19 = *(double *)(pcVar8[lVar9]._M_value + 8) - dVar19;
              auVar5._8_4_ = SUB84(dVar19,0);
              auVar5._0_8_ = *(double *)pcVar8[lVar9]._M_value - dVar18;
              auVar5._12_4_ = (int)((ulong)dVar19 >> 0x20);
              *(undefined1 (*) [16])pcVar8[lVar9]._M_value = auVar5;
              if ((bVar6) &&
                 (dVar19 = this->convergence_threshold_, dVar18 = cabs(dVar18), dVar19 < dVar18)) {
                bVar6 = false;
              }
            }
            else {
              local_70 = lVar9 * 0x10;
              __z = pcVar8 + lVar9;
              lVar10 = 0;
              dVar18 = 1.0;
              dVar19 = 0.0;
              local_b8 = 1.0;
              dStack_b0 = 0.0;
              pcVar12 = pcVar8;
              do {
                local_88._8_4_ = SUB84(dVar19,0);
                local_88._0_8_ = dVar18;
                local_88._12_4_ = (int)((ulong)dVar19 >> 0x20);
                std::complex<double>::operator*=((complex<double> *)local_88,__z);
                uVar14 = local_88._0_4_;
                uVar20 = local_88._4_4_;
                uVar21 = local_88._8_4_;
                uVar22 = local_88._12_4_;
                dVar19 = local_a0[lVar10];
                uVar13 = SUB84(dVar19,0);
                uVar15 = (int)((ulong)dVar19 >> 0x20);
                uVar16 = 0;
                uVar17 = 0;
                if (lVar9 != lVar10) {
                  uStack_60 = 0;
                  dVar18 = *(double *)(__z->_M_value + 8) - *(double *)(pcVar12->_M_value + 8);
                  local_48._M_value._8_4_ = SUB84(dVar18,0);
                  local_48._M_value._0_8_ = *(double *)__z->_M_value - *(double *)pcVar12->_M_value;
                  local_48._M_value._12_4_ = (int)((ulong)dVar18 >> 0x20);
                  local_88._8_8_ = dStack_b0;
                  local_88._0_8_ = local_b8;
                  local_58 = uVar14;
                  uStack_54 = uVar20;
                  uStack_50 = uVar21;
                  uStack_4c = uVar22;
                  local_68 = dVar19;
                  std::complex<double>::operator*=((complex<double> *)local_88,&local_48);
                  local_b8 = (double)local_88._0_8_;
                  dStack_b0 = (double)local_88._8_8_;
                  uVar13 = (undefined4)local_68;
                  uVar15 = local_68._4_4_;
                  uVar16 = (undefined4)uStack_60;
                  uVar17 = uStack_60._4_4_;
                  uVar14 = local_58;
                  uVar20 = uStack_54;
                  uVar21 = uStack_50;
                  uVar22 = uStack_4c;
                }
                dVar18 = (double)CONCAT44(uVar20,uVar14) + (double)CONCAT44(uVar15,uVar13);
                uVar14 = SUB84(dVar18,0);
                dVar19 = (double)CONCAT44(uVar22,uVar21) + (double)CONCAT44(uVar17,uVar16);
                lVar10 = lVar10 + 1;
                pcVar12 = pcVar12 + 1;
              } while (lVar10 < this->num_order_);
              if ((((local_b8 != 0.0) || (NAN(local_b8))) || (dStack_b0 != 0.0)) || (NAN(dStack_b0))
                 ) goto LAB_00105b70;
              *(undefined8 *)(pcVar8->_M_value + local_70) = 0;
              *(undefined8 *)((long)(pcVar8->_M_value + local_70) + 8) = 0;
            }
            lVar9 = lVar9 + 1;
            uVar11 = (ulong)this->num_order_;
          } while (lVar9 < (long)uVar11);
          if (bVar6) goto LAB_00105bf0;
          uVar7 = (int)local_78 + 1;
          local_78 = (ulong)uVar7;
        } while ((int)uVar7 < this->num_iteration_);
      }
      bVar6 = true;
    }
  }
  return bVar6;
}

Assistant:

bool DurandKernerMethod::Run(const std::vector<double>& coefficients,
                             std::vector<std::complex<double> >* roots,
                             bool* is_converged) const {
  // Check inputs.
  if (!is_valid_ ||
      coefficients.size() != static_cast<std::size_t>(num_order_) ||
      NULL == roots || NULL == is_converged) {
    return false;
  }

  // Prepare memories.
  if (roots->size() != static_cast<std::size_t>(num_order_)) {
    roots->resize(num_order_);
  }

  const double* a(&(coefficients[0]));
  std::complex<double>* x(&((*roots)[0]));

  *is_converged = false;

  // Set initial roots using the Aberth's approach.
  {
    double radius(0.0);
    for (int m(1); m < num_order_; ++m) {
      const double r(2.0 * std::pow(std::fabs(a[m]), 1.0 / (m + 1)));
      if (radius < r) {
        radius = r;
      }
    }

    const double center(-a[0] / num_order_);
    for (int m(0); m < num_order_; ++m) {
      x[m].real(center + radius * cosine_table_[m]);
      x[m].imag(center + radius * sine_table_[m]);
    }
  }

  // Find roots using the Durand-Kerner method.
  for (int n(0); n < num_iteration_; ++n) {
    bool halt(true);

    for (int m(0); m < num_order_; ++m) {
      std::complex<double> numerator(1.0);
      std::complex<double> denominator(1.0);
      for (int l(0); l < num_order_; ++l) {
        numerator = numerator * x[m] + std::complex<double>(a[l]);
        if (m != l) denominator = denominator * (x[m] - x[l]);
      }
      if (0.0 == denominator.real() && 0.0 == denominator.imag()) {
        x[m] = 0.0;
      } else {
        const std::complex<double> delta(numerator / denominator);
        x[m] -= delta;
        if (halt && convergence_threshold_ < std::abs(delta)) {
          halt = false;
        }
      }
    }

    if (halt) {
      *is_converged = true;
      break;
    }
  }

  return true;
}